

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O3

void __thiscall
Database_Allocate16Bytes_Test::Database_Allocate16Bytes_Test(Database_Allocate16Bytes_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_Database).super_Test._vptr_Test = (_func_int **)&PTR__Database_0026a450;
  in_memory_store::in_memory_store(&(this->super_Database).store_);
  (this->super_Database).super_Test._vptr_Test = (_func_int **)&PTR__Database_0026a070;
  return;
}

Assistant:

TEST_F (Database, Allocate16Bytes) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    // Initial allocation.
    constexpr auto size = 16U;
    constexpr auto align = 1U;
    pstore::address addr = db.allocate (size, align);
    EXPECT_EQ (pstore::leader_size + sizeof (pstore::trailer), addr.absolute ());

    // Subsequent allocation.
    pstore::address addr2 = db.allocate (size, align);
    EXPECT_EQ (addr.absolute () + 16, addr2.absolute ());
}